

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O3

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>,double>
               (AVisitor<hiberlite::UpdateBean> *ar,
               set<double,_std::less<double>,_std::allocator<double>_> *m,uint param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  set<double,_std::less<double>,_std::allocator<double>_> *local_a0;
  _Base_ptr p_Stack_98;
  double local_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  local_68;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"items","");
  p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_88,local_88 + local_80);
  local_a0 = m;
  p_Stack_98 = p_Var2;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  paVar1 = &local_68.name.field_2;
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_c0,local_c0 + local_b8);
  local_68.stream.xx = local_90;
  local_68.stream.ct = local_a0;
  local_68.stream.it._M_node = p_Stack_98;
  AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::set<Key>& m, const unsigned int)
{
	typedef Key ElType;
	collection_nvp<ElType,stl_stream_adapter<ElType,std::set<Key> > >
			body( "items", stl_stream_adapter<ElType,std::set<Key> >(m) );
	ar & body;
}